

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O3

void __thiscall
OnDiskIterator::OnDiskIterator
          (OnDiskIterator *this,DatabaseName *name,DatabaseName *datafile_name,uint64_t total_files,
          uint64_t byte_offset,uint64_t file_offset,time_t last_read_time)

{
  DatabaseName::DatabaseName(&this->name,name);
  DatabaseName::DatabaseName(&this->datafile_name,datafile_name);
  this->total_files = total_files;
  this->byte_offset = byte_offset;
  this->file_offset = file_offset;
  this->last_read_time = last_read_time;
  return;
}

Assistant:

OnDiskIterator::OnDiskIterator(const DatabaseName &name,
                               const DatabaseName &datafile_name,
                               uint64_t total_files, uint64_t byte_offset,
                               uint64_t file_offset, std::time_t last_read_time)
    : name(name),
      datafile_name(datafile_name),
      total_files(total_files),
      byte_offset(byte_offset),
      file_offset(file_offset),
      last_read_time(last_read_time) {}